

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::
str<char_const*&,char_const(&)[2],int&,char_const(&)[3],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String>
          (String *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],int *params_2,
          char (*params_3) [3],int *params_4,char (*params_5) [3],LogSeverity *params_6,
          char (*params_7) [3],String *params_8)

{
  char *pcVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff28;
  ArrayPtr<const_char> local_d0;
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  CappedArray<char,_14UL> local_60;
  CappedArray<char,_14UL> local_48;
  
  local_80 = toCharSequence<char_const*&>((char **)this);
  local_90 = toCharSequence<char_const(&)[2]>((char (*) [2])params);
  toCharSequence<int&>(&local_48,(kj *)params_1,(int *)local_90.size_);
  local_a0 = toCharSequence<char_const(&)[3]>((char (*) [3])params_2);
  toCharSequence<int&>(&local_60,(kj *)params_3,(int *)local_a0.size_);
  local_b0 = toCharSequence<char_const(&)[3]>((char (*) [3])params_4);
  local_c0 = (ArrayPtr<const_char>)toCharSequence<kj::LogSeverity&>((LogSeverity *)params_5);
  local_d0 = toCharSequence<char_const(&)[3]>((char (*) [3])params_6);
  pcVar1 = *(char **)(params_7[2] + 2);
  local_70.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_70.ptr = *(char **)params_7;
  }
  local_70.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_70.size_ = (size_t)(pcVar1 + -1);
  }
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_80,&local_90,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)&local_a0,(ArrayPtr<const_char> *)&local_60,
             (CappedArray<char,_14UL> *)&local_b0,&local_c0,(StringPtr *)&local_d0,&local_70,
             in_stack_ffffffffffffff28);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}